

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace-type-from-pseudo-trace-type.cpp
# Opt level: O2

Up __thiscall
yactfr::internal::TraceTypeFromPseudoTraceTypeConverter::_traceTypeFromPseudoTraceType
          (TraceTypeFromPseudoTraceTypeConverter *this)

{
  TypeId TVar1;
  TypeId TVar2;
  PseudoDst *in_RSI;
  long *plVar3;
  undefined1 auStack_78 [24];
  DataStreamTypeSet dstSet;
  
  PseudoTraceType::validate((PseudoTraceType *)in_RSI->_id);
  dstSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &dstSet._M_t._M_impl.super__Rb_tree_header._M_header;
  dstSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  dstSet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  dstSet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  plVar3 = (long *)(in_RSI->_id + 0x100);
  dstSet._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       dstSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (plVar3 = (long *)*plVar3, plVar3 != (long *)0x0) {
    _dstFromPseudoDst((TraceTypeFromPseudoTraceTypeConverter *)auStack_78,in_RSI);
    std::
    _Rb_tree<std::unique_ptr<yactfr::DataStreamType_const,std::default_delete<yactfr::DataStreamType_const>>,std::unique_ptr<yactfr::DataStreamType_const,std::default_delete<yactfr::DataStreamType_const>>,std::_Identity<std::unique_ptr<yactfr::DataStreamType_const,std::default_delete<yactfr::DataStreamType_const>>>,yactfr::internal::DstIdComp,std::allocator<std::unique_ptr<yactfr::DataStreamType_const,std::default_delete<yactfr::DataStreamType_const>>>>
    ::
    _M_insert_unique<std::unique_ptr<yactfr::DataStreamType_const,std::default_delete<yactfr::DataStreamType_const>>>
              ((_Rb_tree<std::unique_ptr<yactfr::DataStreamType_const,std::default_delete<yactfr::DataStreamType_const>>,std::unique_ptr<yactfr::DataStreamType_const,std::default_delete<yactfr::DataStreamType_const>>,std::_Identity<std::unique_ptr<yactfr::DataStreamType_const,std::default_delete<yactfr::DataStreamType_const>>>,yactfr::internal::DstIdComp,std::allocator<std::unique_ptr<yactfr::DataStreamType_const,std::default_delete<yactfr::DataStreamType_const>>>>
                *)&dstSet,
               (unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>
                *)auStack_78);
    std::
    unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>::
    ~unique_ptr((unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>
                 *)auStack_78);
  }
  TVar1 = in_RSI->_id;
  auStack_78._12_4_ = *(undefined4 *)(TVar1 + 8);
  auStack_78._8_4_ = *(_Rb_tree_color *)(TVar1 + 0xc);
  _scopeStructTypeFromPseudoDt
            ((TraceTypeFromPseudoTraceTypeConverter *)auStack_78,(PseudoDt *)in_RSI,
             (Scope)*(undefined8 *)(TVar1 + 0xb8),(PseudoDst *)0x0,(PseudoErt *)0x0);
  TVar2 = in_RSI->_id;
  tryCloneAttrs((MapItem *)(auStack_78 + 0x10));
  std::
  make_unique<yactfr::TraceType_const,unsigned_int,unsigned_int,boost::optional<std::__cxx11::string>const&,boost::optional<std::__cxx11::string>const&,boost::optional<std::__cxx11::string>const&,yactfr::TraceEnvironment_const&,std::unique_ptr<yactfr::StructureType_const,std::default_delete<yactfr::StructureType_const>>,std::set<std::unique_ptr<yactfr::ClockType_const,std::default_delete<yactfr::ClockType_const>>,yactfr::internal::ClkTypeAddrComp,std::allocator<std::unique_ptr<yactfr::ClockType_const,std::default_delete<yactfr::ClockType_const>>>>,std::set<std::unique_ptr<yactfr::DataStreamType_const,std::default_delete<yactfr::DataStreamType_const>>,yactfr::internal::DstIdComp,std::allocator<std::unique_ptr<yactfr::DataStreamType_const,std::default_delete<yactfr::DataStreamType_const>>>>,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
            ((uint *)this,(uint *)(auStack_78 + 0xc),
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(auStack_78 + 8),
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(TVar1 + 0x10),
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(TVar1 + 0x38),(TraceEnvironment *)(TVar1 + 0x60),
             (unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
              *)(TVar1 + 0x88),
             (set<std::unique_ptr<const_yactfr::ClockType,_std::default_delete<const_yactfr::ClockType>_>,_yactfr::internal::ClkTypeAddrComp,_std::allocator<std::unique_ptr<const_yactfr::ClockType,_std::default_delete<const_yactfr::ClockType>_>_>_>
              *)auStack_78,
             (set<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>,_yactfr::internal::DstIdComp,_std::allocator<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>_>_>
              *)(TVar2 + 0xc0),
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &dstSet);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             (auStack_78 + 0x10));
  std::unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>::
  ~unique_ptr((unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
               *)auStack_78);
  std::
  _Rb_tree<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>,_std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>,_std::_Identity<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>_>,_yactfr::internal::DstIdComp,_std::allocator<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>_>_>
  ::~_Rb_tree(&dstSet._M_t);
  return (__uniq_ptr_data<const_yactfr::TraceType,_std::default_delete<const_yactfr::TraceType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::TraceType,_std::default_delete<const_yactfr::TraceType>,_true,_true>
            )this;
}

Assistant:

TraceType::Up TraceTypeFromPseudoTraceTypeConverter::_traceTypeFromPseudoTraceType()
{
    // validate first
    _pseudoTraceType->validate();

    DataStreamTypeSet dstSet;

    for (auto& idPseudoDstPair : _pseudoTraceType->pseudoDsts()) {
        dstSet.insert(this->_dstFromPseudoDst(*idPseudoDstPair.second));
    }

    // create yactfr trace type
    return TraceType::create(_pseudoTraceType->majorVersion(), _pseudoTraceType->minorVersion(),
                             _pseudoTraceType->ns(), _pseudoTraceType->name(),
                             _pseudoTraceType->uid(), _pseudoTraceType->env(),
                             this->_scopeStructTypeFromPseudoDt(_pseudoTraceType->pseudoPktHeaderType(),
                                                                Scope::PacketHeader),
                             std::move(_pseudoTraceType->clkTypes()), std::move(dstSet),
                             tryCloneAttrs(_pseudoTraceType->attrs()));
}